

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall MlmWrap::addSubToList(MlmWrap *this,HighFreqSub *newSub)

{
  value_type *in_RDI;
  vector<HighFreqSub_*,_std::allocator<HighFreqSub_*>_> *unaff_retaddr;
  
  std::vector<HighFreqSub_*,_std::allocator<HighFreqSub_*>_>::push_back(unaff_retaddr,in_RDI);
  return 0;
}

Assistant:

int MlmWrap::addSubToList(HighFreqSub *newSub) {
    hfSubs.push_back(newSub);
    //todo: possibly check for duplicates?
    return(0);
}